

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

bool * __thiscall google::protobuf::RepeatedField<bool>::at(RepeatedField<bool> *this,int index)

{
  LogMessage *pLVar1;
  bool *pbVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (index < 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x286);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) >= (0): ");
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->current_size_ <= index) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x287);
    pLVar1 = internal::LogMessage::operator<<(&local_50,"CHECK failed: (index) < (current_size_): ")
    ;
    internal::LogFinisher::operator=(&local_51,pLVar1);
    internal::LogMessage::~LogMessage(&local_50);
  }
  pbVar2 = elements(this);
  return pbVar2 + index;
}

Assistant:

inline const Element& RepeatedField<Element>::at(int index) const {
  GOOGLE_CHECK_GE(index, 0);
  GOOGLE_CHECK_LT(index, current_size_);
  return elements()[index];
}